

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleValue.cpp
# Opt level: O2

void __thiscall bubbleJson::BubbleValue::MemoryFreeValue(BubbleValue *this)

{
  ValueTypes VVar1;
  reference this_00;
  _Base_ptr p_Var2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
  *this_01;
  int i;
  ulong __n;
  
  this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
             *)(this->u).string.literal;
  VVar1 = this->type;
  if (VVar1 == ValueType_String) {
    free(this_01);
  }
  else {
    if (VVar1 == ValueType_Object) {
      for (p_Var2 = (this_01->_M_impl).super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(this_01->_M_impl).super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        MemoryFreeValue((BubbleValue *)(p_Var2 + 2));
      }
      this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                 *)(this->u).string.literal;
      if (this_01 !=
          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
           *)0x0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
        ::~_Rb_tree(this_01);
      }
    }
    else {
      if (VVar1 != ValueType_Array) goto LAB_0011055e;
      for (__n = 0; __n < (ulong)((*(long *)&(this_01->_M_impl).super__Rb_tree_header._M_header -
                                  *(long *)&this_01->_M_impl) / 0x18); __n = __n + 1) {
        this_00 = std::vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>::at
                            ((vector<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>
                              *)this_01,__n);
        MemoryFreeValue(this_00);
        this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bubbleJson::BubbleValue>_>_>
                   *)(this->u).string.literal;
      }
      std::_Vector_base<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>::
      ~_Vector_base((_Vector_base<bubbleJson::BubbleValue,_std::allocator<bubbleJson::BubbleValue>_>
                     *)this_01);
    }
    ::operator_delete(this_01);
  }
  (this->u).number = 0.0;
LAB_0011055e:
  this->type = ValueType_Null;
  return;
}

Assistant:

void BubbleValue::MemoryFreeValue()
{
    auto members = this->u.object.members;
    switch (this->type)
    {
        case ValueType_String:
            free(this->u.string.literal);
            this->u.string.literal = nullptr;
            break;
        case ValueType_Array:
            for (int i = 0; i < this->u.array.elements->size(); ++i)
            {
                this->u.array.elements->at(i).MemoryFreeValue();
            }
            delete this->u.array.elements;
            this->u.array.elements = nullptr;
            break;
        case ValueType_Object:
            for (auto it = members->begin(); it != members->end(); ++it)
            {
                it->second.MemoryFreeValue();
            }
            delete this->u.object.members;
            this->u.object.members = nullptr;
            break;
        default:
            break;
    }

    this->type = ValueType_Null;
}